

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

void __thiscall
dynet::UnidirectionalTreeLSTMBuilder::UnidirectionalTreeLSTMBuilder
          (UnidirectionalTreeLSTMBuilder *this,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  ParameterCollection *this_00;
  allocator local_225;
  uint local_224;
  string local_220;
  VanillaLSTMBuilder local_200;
  
  (this->super_TreeLSTMBuilder).super_RNNBuilder.cur = -1;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.sm.q_ = CREATED;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder._vptr_RNNBuilder =
       (_func_int **)&PTR__UnidirectionalTreeLSTMBuilder_00710638;
  this_00 = &this->local_model;
  local_224 = hidden_dim;
  ParameterCollection::ParameterCollection(this_00);
  VanillaLSTMBuilder::VanillaLSTMBuilder(&this->node_builder);
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_220,"unidirectional-tree-lstm-builder",&local_225);
  ParameterCollection::add_subcollection((ParameterCollection *)&local_200,model,&local_220);
  ParameterCollection::operator=(this_00,(ParameterCollection *)&local_200);
  ParameterCollection::~ParameterCollection((ParameterCollection *)&local_200);
  std::__cxx11::string::~string((string *)&local_220);
  VanillaLSTMBuilder::VanillaLSTMBuilder(&local_200,layers,input_dim,local_224,this_00,false);
  VanillaLSTMBuilder::operator=(&this->node_builder,&local_200);
  VanillaLSTMBuilder::~VanillaLSTMBuilder(&local_200);
  return;
}

Assistant:

UnidirectionalTreeLSTMBuilder::UnidirectionalTreeLSTMBuilder(unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) {
  local_model = model.add_subcollection("unidirectional-tree-lstm-builder");
  node_builder = LSTMBuilder(layers, input_dim, hidden_dim, local_model);
}